

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_char>
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *a)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar ***pppuVar4;
  float ***pppfVar5;
  uchar *puVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  setSize(this,a->width,a->height,(long)a->depth);
  iVar1 = this->depth;
  if (0 < (long)iVar1) {
    lVar2 = this->width;
    lVar3 = this->height;
    lVar8 = 0;
    do {
      if (0 < lVar3) {
        pppuVar4 = a->img;
        pppfVar5 = this->img;
        lVar9 = 0;
        do {
          if (0 < lVar2) {
            puVar6 = pppuVar4[lVar8][lVar9];
            pfVar7 = pppfVar5[lVar8][lVar9];
            lVar10 = 0;
            do {
              pfVar7[lVar10] = (float)puVar6[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar2 != lVar10);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar3);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return;
}

Assistant:

void setImageLimited(const Image<S> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      for (int j=0; j<depth; j++)
        for (long k=0; k<height; k++)
          for (long i=0; i<width; i++)
          {
            img[j][k][i]=ptraits::limit(static_cast<work_t>(a.get(i, k, j)));
          }
    }